

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O3

void massageldifus(Item *qexp,Item *qb1,Item *qb2,Symbol *indx)

{
  Item **ppIVar1;
  Symbol *s;
  Item *pIVar2;
  Item *pIVar3;
  Item *item;
  Item *pIVar4;
  int iVar5;
  Item *pIVar6;
  Symbol *pSVar7;
  Item *pIVar8;
  
  insertstr(qb2->next,"*/\n");
  pIVar6 = qexp;
  if (indx != (Symbol *)0x0) {
    if (qexp != qb1) {
      do {
        if ((pIVar6->itemtype == 1) && ((Symbol *)(pIVar6->element).itm == indx)) {
          replacstr(pIVar6,"_i");
        }
        ppIVar1 = &pIVar6->next;
        pIVar6 = *ppIVar1;
      } while (*ppIVar1 != qb1);
    }
    pIVar6 = qexp->prev->prev;
  }
  insertstr(pIVar6->prev,"/*");
  if (ldifuslist == (List *)0x0) {
    ldifuslist = newlist();
  }
  pIVar6 = qb1->next;
  do {
    if (pIVar6 == qb2) {
      return;
    }
    s = (pIVar6->element).sym;
    pIVar2 = pIVar6->next;
    if (((s->subtype & 0x10) == 0) && (iVar5 = in_solvefor(s), iVar5 != 0)) {
      delete(pIVar6);
      diag(((pIVar6->element).sym)->name,
           "must be a (solved) STATE in a LONGITUDINAL_DIFFUSION statement");
    }
    lappendsym(ldifuslist,s);
    lappenditem(ldifuslist,qexp);
    lappenditem(ldifuslist,qb1);
    if (compartlist == (List *)0x0) {
LAB_0010f9c4:
      diag(((pIVar6->element).sym)->name,"must be declared in COMPARTMENT");
    }
    pSVar7 = (Symbol *)0x0;
    pIVar8 = compartlist;
    do {
      pIVar3 = pIVar8->next;
      if (pIVar3 == compartlist) {
        if (s != pSVar7) goto LAB_0010f9c4;
        goto LAB_0010f9da;
      }
      pIVar8 = pIVar3->next->next;
      item = (pIVar3->next->element).itm;
      for (pIVar4 = item; pIVar4 != (pIVar8->element).itm; pIVar4 = pIVar4->next) {
        if ((pIVar4->itemtype == 1) && (pSVar7 = (Symbol *)(pIVar4->element).itm, s == pSVar7))
        goto LAB_0010f99a;
      }
    } while (s != pSVar7);
LAB_0010f99a:
    lappenditem(ldifuslist,(pIVar3->element).itm);
    lappenditem(ldifuslist,item);
LAB_0010f9da:
    lappendstr(ldifuslist,"0");
    lappendstr(ldifuslist,"");
    pIVar6 = pIVar2;
  } while( true );
}

Assistant:

void massageldifus(qexp, qb1, qb2, indx)
	Item *qexp, *qb1, *qb2;
	Symbol *indx;
{
	Item *q, *qs, *q1;
	Symbol* s, *s2;
	
	/* surround the statement with comments so that the expession
	   will benignly exist for later use */
	/*SUPPRESS 440*/
	Insertstr(qb2->next, "*/\n");

	if (indx) {
		for (q = qexp; q != qb1; q = q->next) {
			if (q->itemtype == SYMBOL && SYM(q) == indx) {
				replacstr(q, "_i");
			}
		}
		/*SUPPRESS 440*/
		Insertstr(qexp->prev->prev->prev, "/*");
	}else{
		/*SUPPRESS 440*/
		Insertstr(qexp->prev, "/*");
	}
	if (!ldifuslist) {
		ldifuslist = newlist();
	}
	for (q = qb1->next; q != qb2; q = qs) {
		qs = q->next;
		s = SYM(q);
		s2 = SYM0;
		if (!(s->subtype & STAT) && in_solvefor(s)) {
			delete(q);
diag(SYM(q)->name, "must be a (solved) STATE in a LONGITUDINAL_DIFFUSION statement");
		}
		lappendsym(ldifuslist, s);
		Lappenditem(ldifuslist, qexp);
		Lappenditem(ldifuslist, qb1);
		/* store the COMPARTMENT volume expression for this sym */
		q1 = compartlist;
		if (q1) ITERATE(q1, compartlist) {
			Item *qexp, *qb1, *qb2, *q;
			qexp = ITM(q1); q1 = q1->next;
			qb1 = ITM(q1); q1 = q1->next;
			qb2 = ITM(q1);
			for (q = qb1; q != qb2; q = q->next) {
				if (q->itemtype == SYMBOL) {
					s2 = SYM(q);
					if (s == s2) break;
				}
			}
			if (s == s2) {
				lappenditem(ldifuslist, qexp);
				lappenditem(ldifuslist, qb1);
				break;
			}
		}
		if (s != s2) {
			diag(SYM(q)->name, "must be declared in COMPARTMENT");
		}
		lappendstr(ldifuslist, "0"); /* will be flux conc index if any */
		lappendstr(ldifuslist, ""); /* will be dflux/dconc if any */
	}
}